

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageLayerComparer::ImageLayerComparer
          (ImageLayerComparer *this,LayeredImage *reference,IVec2 *relevantRegion)

{
  int iVar1;
  IVec3 *pIVar2;
  IVec2 *relevantRegion_local;
  LayeredImage *reference_local;
  ImageLayerComparer *this_local;
  
  ImageLayerVerifier::ImageLayerVerifier(&this->super_ImageLayerVerifier);
  (this->super_ImageLayerVerifier)._vptr_ImageLayerVerifier = (_func_int **)&PTR_operator___032c1688
  ;
  this->m_reference = reference;
  iVar1 = tcu::Vector<int,_2>::x(relevantRegion);
  if ((0 < iVar1) && (iVar1 = tcu::Vector<int,_2>::y(relevantRegion), 0 < iVar1)) {
    tcu::Vector<int,_2>::Vector(&this->m_relevantRegion,relevantRegion);
    return;
  }
  pIVar2 = LayeredImage::getSize(reference);
  tcu::Vector<int,_3>::swizzle((Vector<int,_3> *)&this->m_relevantRegion,(int)pIVar2,0);
  return;
}

Assistant:

ImageLayerComparer (const LayeredImage& reference,
						const IVec2& relevantRegion = IVec2(0) /* If given, only check this region of each slice. */)
		: m_reference		(reference)
		, m_relevantRegion	(relevantRegion.x() > 0 && relevantRegion.y() > 0 ? relevantRegion : reference.getSize().swizzle(0, 1))
	{
	}